

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersector1<8,_16777232,_false,_embree::avx512::ArrayIntersector1<embree::avx512::TriangleMvMBIntersector1Moeller<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  RTCRayQueryContext *pRVar3;
  bool bVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  byte bVar14;
  int iVar15;
  AABBNodeMB4D *node1;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  ulong unaff_R12;
  size_t mask;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar24 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  float fVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [64];
  undefined1 auVar48 [32];
  undefined4 uVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [64];
  uint uVar56;
  uint uVar57;
  uint uVar58;
  uint uVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  uint local_260c;
  int local_25f4;
  RTCIntersectArguments *local_25f0;
  long local_25e8;
  ulong local_25e0;
  Geometry *local_25d8;
  ulong local_25d0;
  ulong local_25c8;
  ulong local_25c0;
  ulong local_25b8;
  ulong local_25b0;
  ulong *local_25a8;
  Scene *local_25a0;
  RTCFilterFunctionNArguments local_2598;
  float local_2568;
  undefined4 local_2564;
  undefined4 local_2560;
  float local_255c;
  float local_2558;
  undefined4 local_2554;
  uint local_2550;
  uint local_254c;
  uint local_2548;
  undefined1 local_2538 [16];
  undefined1 local_2528 [16];
  undefined1 local_2518 [16];
  undefined1 local_2508 [16];
  byte local_24f7;
  float local_24e8 [4];
  float local_24d8 [4];
  undefined1 local_24c8 [16];
  undefined1 local_24b8 [16];
  undefined1 local_24a8 [16];
  undefined1 local_2498 [16];
  undefined1 local_2488 [16];
  undefined1 local_2478 [32];
  undefined1 local_2458 [32];
  undefined1 local_2438 [32];
  undefined1 local_2418 [32];
  undefined1 local_23f8 [32];
  undefined1 local_23d8 [32];
  undefined1 local_23b8 [32];
  undefined1 local_2398 [32];
  ulong local_2378;
  undefined4 local_2370 [2];
  ulong local_2368 [1127];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_2378 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
    local_2370[0] = 0;
    if (local_2378 != 8) {
      aVar2 = (ray->super_RayK<1>).dir.field_0.field_1;
      auVar24 = vmaxss_avx(ZEXT816(0) << 0x40,
                           ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
      auVar34 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
      auVar22._8_4_ = 0x7fffffff;
      auVar22._0_8_ = 0x7fffffff7fffffff;
      auVar22._12_4_ = 0x7fffffff;
      auVar22 = vandps_avx512vl((undefined1  [16])aVar2,auVar22);
      auVar32._8_4_ = 0x219392ef;
      auVar32._0_8_ = 0x219392ef219392ef;
      auVar32._12_4_ = 0x219392ef;
      uVar20 = vcmpps_avx512vl(auVar22,auVar32,1);
      bVar4 = (bool)((byte)uVar20 & 1);
      auVar33._0_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * (int)aVar2.x;
      bVar4 = (bool)((byte)(uVar20 >> 1) & 1);
      auVar33._4_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * (int)aVar2.y;
      bVar4 = (bool)((byte)(uVar20 >> 2) & 1);
      auVar33._8_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * (int)aVar2.z;
      bVar4 = (bool)((byte)(uVar20 >> 3) & 1);
      auVar33._12_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * aVar2.field_3.a;
      auVar22 = vrcp14ps_avx512vl(auVar33);
      auVar23._8_4_ = 0x3f800000;
      auVar23._0_8_ = &DAT_3f8000003f800000;
      auVar23._12_4_ = 0x3f800000;
      auVar23 = vfnmadd213ps_avx512vl(auVar33,auVar22,auVar23);
      local_25a8 = local_2368;
      auVar33 = vfmadd132ps_fma(auVar23,auVar22,auVar22);
      auVar37 = vbroadcastss_avx512vl(auVar33);
      auVar64 = ZEXT3264(auVar37);
      auVar22 = vmovshdup_avx(auVar33);
      auVar37 = vbroadcastsd_avx512vl(auVar22);
      auVar65 = ZEXT3264(auVar37);
      auVar23 = vshufpd_avx(auVar33,auVar33,1);
      auVar54._8_4_ = 2;
      auVar54._0_8_ = 0x200000002;
      auVar54._12_4_ = 2;
      auVar54._16_4_ = 2;
      auVar54._20_4_ = 2;
      auVar54._24_4_ = 2;
      auVar54._28_4_ = 2;
      auVar37 = vpermps_avx512vl(auVar54,ZEXT1632(auVar33));
      auVar66 = ZEXT3264(auVar37);
      fVar44 = auVar33._0_4_ * (ray->super_RayK<1>).org.field_0.m128[0];
      auVar42._4_4_ = fVar44;
      auVar42._0_4_ = fVar44;
      auVar42._8_4_ = fVar44;
      auVar42._12_4_ = fVar44;
      auVar42._16_4_ = fVar44;
      auVar42._20_4_ = fVar44;
      auVar42._24_4_ = fVar44;
      auVar42._28_4_ = fVar44;
      auVar37 = vbroadcastss_avx512vl(ZEXT416(1));
      auVar67 = ZEXT3264(auVar37);
      auVar39 = ZEXT1632(CONCAT412(auVar33._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3],
                                   CONCAT48(auVar33._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2]
                                            ,CONCAT44(auVar33._4_4_ *
                                                      (ray->super_RayK<1>).org.field_0.m128[1],
                                                      fVar44))));
      auVar38 = vpermps_avx512vl(auVar37,auVar39);
      auVar55 = ZEXT3264(auVar38);
      auVar37 = vpermps_avx2(auVar54,auVar39);
      local_25b0 = (ulong)(auVar33._0_4_ < 0.0) << 5;
      local_25b8 = (ulong)(auVar22._0_4_ < 0.0) << 5 | 0x40;
      local_25c0 = (ulong)(auVar23._0_4_ < 0.0) << 5 | 0x80;
      local_25c8 = local_25b0 ^ 0x20;
      local_25d0 = local_25b8 ^ 0x20;
      uVar20 = local_25c0 ^ 0x20;
      auVar39 = vbroadcastss_avx512vl(auVar24);
      auVar68 = ZEXT3264(auVar39);
      auVar40._8_4_ = 0x80000000;
      auVar40._0_8_ = 0x8000000080000000;
      auVar40._12_4_ = 0x80000000;
      auVar40._16_4_ = 0x80000000;
      auVar40._20_4_ = 0x80000000;
      auVar40._24_4_ = 0x80000000;
      auVar40._28_4_ = 0x80000000;
      uVar49 = auVar34._0_4_;
      auVar47 = ZEXT3264(CONCAT428(uVar49,CONCAT424(uVar49,CONCAT420(uVar49,CONCAT416(uVar49,
                                                  CONCAT412(uVar49,CONCAT48(uVar49,CONCAT44(uVar49,
                                                  uVar49))))))));
      auVar39 = vxorps_avx512vl(auVar42,auVar40);
      auVar69 = ZEXT3264(auVar39);
      auVar38 = vxorps_avx512vl(auVar38,auVar40);
      auVar70 = ZEXT3264(auVar38);
      auVar37 = vxorps_avx512vl(auVar37,auVar40);
      auVar71 = ZEXT3264(auVar37);
      auVar37 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
      auVar72 = ZEXT3264(auVar37);
      auVar37 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
      auVar73 = ZEXT3264(auVar37);
      auVar24 = vpbroadcastd_avx512vl(ZEXT416(0x80000000));
      auVar74 = ZEXT1664(auVar24);
      auVar37 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
      auVar75 = ZEXT3264(auVar37);
      auVar37 = vpmovsxbd_avx512vl(ZEXT816(0x5040302010008));
      auVar76 = ZEXT3264(auVar37);
      do {
        do {
          do {
            if (local_25a8 == &local_2378) {
              return;
            }
            pfVar1 = (float *)(local_25a8 + -1);
            local_25a8 = local_25a8 + -2;
          } while ((ray->super_RayK<1>).tfar < *pfVar1);
          uVar21 = *local_25a8;
          do {
            if ((uVar21 & 8) == 0) {
              uVar16 = uVar21 & 0xfffffffffffffff0;
              uVar49 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 0xc);
              auVar48._4_4_ = uVar49;
              auVar48._0_4_ = uVar49;
              auVar48._8_4_ = uVar49;
              auVar48._12_4_ = uVar49;
              auVar48._16_4_ = uVar49;
              auVar48._20_4_ = uVar49;
              auVar48._24_4_ = uVar49;
              auVar48._28_4_ = uVar49;
              auVar24 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar16 + 0x100 + local_25b0),auVar48,
                                        *(undefined1 (*) [32])(uVar16 + 0x40 + local_25b0));
              auVar37 = vfmadd213ps_avx512vl(ZEXT1632(auVar24),auVar64._0_32_,auVar69._0_32_);
              auVar38 = vmaxps_avx512vl(auVar68._0_32_,auVar37);
              auVar24 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar16 + 0x100 + local_25b8),auVar48,
                                        *(undefined1 (*) [32])(uVar16 + 0x40 + local_25b8));
              auVar34 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar16 + 0x100 + local_25c0),auVar48,
                                        *(undefined1 (*) [32])(uVar16 + 0x40 + local_25c0));
              auVar37 = vfmadd213ps_avx512vl(ZEXT1632(auVar24),auVar65._0_32_,auVar70._0_32_);
              auVar39 = vfmadd213ps_avx512vl(ZEXT1632(auVar34),auVar66._0_32_,auVar71._0_32_);
              auVar37 = vmaxps_avx(auVar37,auVar39);
              auVar37 = vmaxps_avx(auVar38,auVar37);
              auVar55 = ZEXT3264(auVar37);
              auVar24 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar16 + 0x100 + local_25c8),auVar48,
                                        *(undefined1 (*) [32])(uVar16 + 0x40 + local_25c8));
              auVar34 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar16 + 0x100 + local_25d0),auVar48,
                                        *(undefined1 (*) [32])(uVar16 + 0x40 + local_25d0));
              auVar39 = vfmadd213ps_avx512vl(ZEXT1632(auVar24),auVar64._0_32_,auVar69._0_32_);
              auVar38 = vfmadd213ps_avx512vl(ZEXT1632(auVar34),auVar65._0_32_,auVar70._0_32_);
              auVar24 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar16 + 0x100 + uVar20),auVar48,
                                        *(undefined1 (*) [32])(uVar16 + 0x40 + uVar20));
              auVar40 = vfmadd213ps_avx512vl(ZEXT1632(auVar24),auVar66._0_32_,auVar71._0_32_);
              auVar38 = vminps_avx(auVar38,auVar40);
              auVar39 = vminps_avx(auVar47._0_32_,auVar39);
              auVar38 = vminps_avx(auVar39,auVar38);
              if (((uint)uVar21 & 7) == 6) {
                uVar8 = vcmpps_avx512vl(auVar37,auVar38,2);
                uVar5 = vcmpps_avx512vl(auVar48,*(undefined1 (*) [32])(uVar16 + 0x1c0),0xd);
                uVar6 = vcmpps_avx512vl(auVar48,*(undefined1 (*) [32])(uVar16 + 0x1e0),1);
                bVar14 = (byte)uVar8 & (byte)uVar5 & (byte)uVar6;
              }
              else {
                uVar8 = vcmpps_avx512vl(auVar37,auVar38,2);
                bVar14 = (byte)uVar8;
              }
              unaff_R12 = CONCAT44((int)(unaff_R12 >> 0x20),(uint)bVar14);
            }
            if ((uVar21 & 8) == 0) {
              if (unaff_R12 == 0) {
                iVar15 = 4;
              }
              else {
                auVar37 = *(undefined1 (*) [32])(uVar21 & 0xfffffffffffffff0);
                auVar38 = ((undefined1 (*) [32])(uVar21 & 0xfffffffffffffff0))[1];
                auVar39 = vmovdqa64_avx512vl(auVar72._0_32_);
                auVar54 = auVar55._0_32_;
                auVar39 = vpternlogd_avx512vl(auVar39,auVar54,auVar73._0_32_,0xf8);
                uVar21 = unaff_R12 & 0xffffffff;
                auVar40 = vpcompressd_avx512vl(auVar39);
                bVar4 = (bool)((byte)uVar21 & 1);
                auVar41._0_4_ = (uint)bVar4 * auVar40._0_4_ | (uint)!bVar4 * auVar39._0_4_;
                bVar4 = (bool)((byte)(uVar21 >> 1) & 1);
                auVar41._4_4_ = (uint)bVar4 * auVar40._4_4_ | (uint)!bVar4 * auVar39._4_4_;
                bVar4 = (bool)((byte)(uVar21 >> 2) & 1);
                auVar41._8_4_ = (uint)bVar4 * auVar40._8_4_ | (uint)!bVar4 * auVar39._8_4_;
                bVar4 = (bool)((byte)(uVar21 >> 3) & 1);
                auVar41._12_4_ = (uint)bVar4 * auVar40._12_4_ | (uint)!bVar4 * auVar39._12_4_;
                bVar4 = (bool)((byte)(uVar21 >> 4) & 1);
                auVar41._16_4_ = (uint)bVar4 * auVar40._16_4_ | (uint)!bVar4 * auVar39._16_4_;
                bVar4 = (bool)((byte)(uVar21 >> 5) & 1);
                auVar41._20_4_ = (uint)bVar4 * auVar40._20_4_ | (uint)!bVar4 * auVar39._20_4_;
                bVar4 = (bool)((byte)(uVar21 >> 6) & 1);
                auVar41._24_4_ = (uint)bVar4 * auVar40._24_4_ | (uint)!bVar4 * auVar39._24_4_;
                bVar4 = (bool)((byte)(uVar21 >> 7) & 1);
                auVar41._28_4_ = (uint)bVar4 * auVar40._28_4_ | (uint)!bVar4 * auVar39._28_4_;
                auVar39 = vpermt2q_avx512vl(auVar37,auVar41,auVar38);
                uVar21 = auVar39._0_8_;
                iVar15 = 0;
                uVar16 = unaff_R12 - 1 & unaff_R12;
                if (uVar16 != 0) {
                  auVar39 = vpshufd_avx2(auVar41,0x55);
                  vpermt2q_avx512vl(auVar37,auVar39,auVar38);
                  auVar40 = vpminsd_avx2(auVar41,auVar39);
                  auVar39 = vpmaxsd_avx2(auVar41,auVar39);
                  uVar16 = uVar16 - 1 & uVar16;
                  if (uVar16 == 0) {
                    auVar40 = vpermi2q_avx512vl(auVar40,auVar37,auVar38);
                    uVar21 = auVar40._0_8_;
                    auVar37 = vpermt2q_avx512vl(auVar37,auVar39,auVar38);
                    *local_25a8 = auVar37._0_8_;
                    auVar37 = vpermd_avx2(auVar39,auVar54);
                    *(int *)(local_25a8 + 1) = auVar37._0_4_;
                    local_25a8 = local_25a8 + 2;
                  }
                  else {
                    auVar48 = vpshufd_avx2(auVar41,0xaa);
                    vpermt2q_avx512vl(auVar37,auVar48,auVar38);
                    auVar42 = vpminsd_avx2(auVar40,auVar48);
                    auVar40 = vpmaxsd_avx2(auVar40,auVar48);
                    auVar48 = vpminsd_avx2(auVar39,auVar40);
                    auVar39 = vpmaxsd_avx2(auVar39,auVar40);
                    uVar16 = uVar16 - 1 & uVar16;
                    if (uVar16 == 0) {
                      auVar40 = vpermi2q_avx512vl(auVar42,auVar37,auVar38);
                      uVar21 = auVar40._0_8_;
                      auVar40 = vpermt2q_avx512vl(auVar37,auVar39,auVar38);
                      *local_25a8 = auVar40._0_8_;
                      auVar39 = vpermd_avx2(auVar39,auVar54);
                      *(int *)(local_25a8 + 1) = auVar39._0_4_;
                      auVar37 = vpermt2q_avx512vl(auVar37,auVar48,auVar38);
                      local_25a8[2] = auVar37._0_8_;
                      auVar37 = vpermd_avx2(auVar48,auVar54);
                      *(int *)(local_25a8 + 3) = auVar37._0_4_;
                      local_25a8 = local_25a8 + 4;
                    }
                    else {
                      auVar40 = vpshufd_avx2(auVar41,0xff);
                      vpermt2q_avx512vl(auVar37,auVar40,auVar38);
                      auVar43 = vpminsd_avx2(auVar42,auVar40);
                      auVar40 = vpmaxsd_avx2(auVar42,auVar40);
                      auVar42 = vpminsd_avx2(auVar48,auVar40);
                      auVar40 = vpmaxsd_avx2(auVar48,auVar40);
                      auVar48 = vpminsd_avx2(auVar39,auVar40);
                      auVar39 = vpmaxsd_avx2(auVar39,auVar40);
                      uVar16 = uVar16 - 1 & uVar16;
                      if (uVar16 == 0) {
                        auVar40 = vpermi2q_avx512vl(auVar43,auVar37,auVar38);
                        uVar21 = auVar40._0_8_;
                        auVar40 = vpermt2q_avx512vl(auVar37,auVar39,auVar38);
                        *local_25a8 = auVar40._0_8_;
                        auVar55 = ZEXT3264(auVar54);
                        auVar39 = vpermd_avx2(auVar39,auVar54);
                        *(int *)(local_25a8 + 1) = auVar39._0_4_;
                        auVar39 = vpermt2q_avx512vl(auVar37,auVar48,auVar38);
                        local_25a8[2] = auVar39._0_8_;
                        auVar39 = vpermd_avx2(auVar48,auVar54);
                        *(int *)(local_25a8 + 3) = auVar39._0_4_;
                        auVar37 = vpermt2q_avx512vl(auVar37,auVar42,auVar38);
                        local_25a8[4] = auVar37._0_8_;
                        auVar37 = vpermd_avx2(auVar42,auVar54);
                        *(int *)(local_25a8 + 5) = auVar37._0_4_;
                        local_25a8 = local_25a8 + 6;
                      }
                      else {
                        auVar41 = valignd_avx512vl(auVar41,auVar41,3);
                        auVar40 = vmovdqa64_avx512vl(auVar74._0_32_);
                        auVar40 = vpermt2d_avx512vl(auVar40,auVar75._0_32_,auVar43);
                        auVar40 = vpermt2d_avx512vl(auVar40,auVar76._0_32_,auVar42);
                        auVar42 = vpermt2d_avx512vl(auVar40,auVar76._0_32_,auVar48);
                        auVar40 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                        auVar39 = vpermt2d_avx512vl(auVar42,auVar40,auVar39);
                        auVar55 = ZEXT3264(auVar39);
                        uVar21 = uVar16;
                        do {
                          auVar40 = auVar55._0_32_;
                          auVar39 = vpermps_avx512vl(auVar67._0_32_,auVar41);
                          auVar41 = valignd_avx512vl(auVar41,auVar41,1);
                          vpermt2q_avx512vl(auVar37,auVar41,auVar38);
                          uVar21 = uVar21 - 1 & uVar21;
                          uVar8 = vpcmpd_avx512vl(auVar39,auVar40,5);
                          auVar39 = vpmaxsd_avx2(auVar39,auVar40);
                          bVar14 = (byte)uVar8 << 1;
                          auVar40 = valignd_avx512vl(auVar40,auVar40,7);
                          bVar4 = (bool)((byte)uVar8 & 1);
                          auVar43._4_4_ = (uint)bVar4 * auVar40._4_4_ | (uint)!bVar4 * auVar39._4_4_
                          ;
                          auVar43._0_4_ = auVar39._0_4_;
                          bVar4 = (bool)(bVar14 >> 2 & 1);
                          auVar43._8_4_ = (uint)bVar4 * auVar40._8_4_ | (uint)!bVar4 * auVar39._8_4_
                          ;
                          bVar4 = (bool)(bVar14 >> 3 & 1);
                          auVar43._12_4_ =
                               (uint)bVar4 * auVar40._12_4_ | (uint)!bVar4 * auVar39._12_4_;
                          bVar4 = (bool)(bVar14 >> 4 & 1);
                          auVar43._16_4_ =
                               (uint)bVar4 * auVar40._16_4_ | (uint)!bVar4 * auVar39._16_4_;
                          bVar4 = (bool)(bVar14 >> 5 & 1);
                          auVar43._20_4_ =
                               (uint)bVar4 * auVar40._20_4_ | (uint)!bVar4 * auVar39._20_4_;
                          bVar4 = (bool)(bVar14 >> 6 & 1);
                          auVar43._24_4_ =
                               (uint)bVar4 * auVar40._24_4_ | (uint)!bVar4 * auVar39._24_4_;
                          auVar43._28_4_ =
                               (uint)(bVar14 >> 7) * auVar40._28_4_ |
                               (uint)!(bool)(bVar14 >> 7) * auVar39._28_4_;
                          auVar55 = ZEXT3264(auVar43);
                        } while (uVar21 != 0);
                        lVar19 = POPCOUNT(uVar16) + 3;
                        do {
                          auVar39 = vpermi2q_avx512vl(auVar43,auVar37,auVar38);
                          *local_25a8 = auVar39._0_8_;
                          auVar40 = auVar55._0_32_;
                          auVar39 = vpermd_avx2(auVar40,auVar54);
                          *(int *)(local_25a8 + 1) = auVar39._0_4_;
                          auVar43 = valignd_avx512vl(auVar40,auVar40,1);
                          local_25a8 = local_25a8 + 2;
                          auVar55 = ZEXT3264(auVar43);
                          lVar19 = lVar19 + -1;
                        } while (lVar19 != 0);
                        auVar37 = vpermt2q_avx512vl(auVar37,auVar43,auVar38);
                        uVar21 = auVar37._0_8_;
                        auVar55 = ZEXT3264(auVar54);
                        iVar15 = 0;
                      }
                    }
                  }
                }
              }
            }
            else {
              iVar15 = 6;
            }
          } while (iVar15 == 0);
        } while (iVar15 != 6);
        local_2398 = auVar55._0_32_;
        local_25e8 = (ulong)((uint)uVar21 & 0xf) - 8;
        if (local_25e8 != 0) {
          uVar21 = uVar21 & 0xfffffffffffffff0;
          lVar19 = 0;
          do {
            lVar18 = lVar19 * 0x140;
            uVar49 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 0xc);
            auVar26._4_4_ = uVar49;
            auVar26._0_4_ = uVar49;
            auVar26._8_4_ = uVar49;
            auVar26._12_4_ = uVar49;
            auVar28 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar21 + 0x90 + lVar18),auVar26,
                                      *(undefined1 (*) [16])(uVar21 + lVar18));
            auVar27 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar21 + 0xa0 + lVar18),auVar26,
                                      *(undefined1 (*) [16])(uVar21 + 0x10 + lVar18));
            auVar9 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar21 + 0xb0 + lVar18),auVar26,
                                     *(undefined1 (*) [16])(uVar21 + 0x20 + lVar18));
            auVar24 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar21 + 0xc0 + lVar18),auVar26,
                                      *(undefined1 (*) [16])(uVar21 + 0x30 + lVar18));
            auVar34 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar21 + 0xd0 + lVar18),auVar26,
                                      *(undefined1 (*) [16])(uVar21 + 0x40 + lVar18));
            auVar22 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar21 + 0xe0 + lVar18),auVar26,
                                      *(undefined1 (*) [16])(uVar21 + 0x50 + lVar18));
            auVar23 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar21 + 0xf0 + lVar18),auVar26,
                                      *(undefined1 (*) [16])(uVar21 + 0x60 + lVar18));
            auVar33 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar21 + 0x100 + lVar18),auVar26,
                                      *(undefined1 (*) [16])(uVar21 + 0x70 + lVar18));
            auVar32 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar21 + 0x110 + lVar18),auVar26,
                                      *(undefined1 (*) [16])(uVar21 + 0x80 + lVar18));
            auVar24 = vsubps_avx(auVar28,auVar24);
            auVar34 = vsubps_avx(auVar27,auVar34);
            auVar22 = vsubps_avx(auVar9,auVar22);
            auVar23 = vsubps_avx(auVar23,auVar28);
            auVar33 = vsubps_avx(auVar33,auVar27);
            auVar32 = vsubps_avx(auVar32,auVar9);
            auVar29._0_4_ = auVar34._0_4_ * auVar32._0_4_;
            auVar29._4_4_ = auVar34._4_4_ * auVar32._4_4_;
            auVar29._8_4_ = auVar34._8_4_ * auVar32._8_4_;
            auVar29._12_4_ = auVar34._12_4_ * auVar32._12_4_;
            local_24b8 = vfmsub231ps_fma(auVar29,auVar33,auVar22);
            auVar30._0_4_ = auVar22._0_4_ * auVar23._0_4_;
            auVar30._4_4_ = auVar22._4_4_ * auVar23._4_4_;
            auVar30._8_4_ = auVar22._8_4_ * auVar23._8_4_;
            auVar30._12_4_ = auVar22._12_4_ * auVar23._12_4_;
            local_24a8 = vfmsub231ps_fma(auVar30,auVar32,auVar24);
            auVar31._0_4_ = auVar24._0_4_ * auVar33._0_4_;
            auVar31._4_4_ = auVar24._4_4_ * auVar33._4_4_;
            auVar31._8_4_ = auVar24._8_4_ * auVar33._8_4_;
            auVar31._12_4_ = auVar24._12_4_ * auVar33._12_4_;
            uVar49 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
            auVar60._4_4_ = uVar49;
            auVar60._0_4_ = uVar49;
            auVar60._8_4_ = uVar49;
            auVar60._12_4_ = uVar49;
            uVar49 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
            auVar61._4_4_ = uVar49;
            auVar61._0_4_ = uVar49;
            auVar61._8_4_ = uVar49;
            auVar61._12_4_ = uVar49;
            fVar44 = (ray->super_RayK<1>).dir.field_0.m128[2];
            auVar62._4_4_ = fVar44;
            auVar62._0_4_ = fVar44;
            auVar62._8_4_ = fVar44;
            auVar62._12_4_ = fVar44;
            uVar49 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar25._4_4_ = uVar49;
            auVar25._0_4_ = uVar49;
            auVar25._8_4_ = uVar49;
            auVar25._12_4_ = uVar49;
            auVar25 = vsubps_avx512vl(auVar28,auVar25);
            local_2498 = vfmsub231ps_fma(auVar31,auVar23,auVar34);
            uVar49 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
            auVar28._4_4_ = uVar49;
            auVar28._0_4_ = uVar49;
            auVar28._8_4_ = uVar49;
            auVar28._12_4_ = uVar49;
            auVar26 = vsubps_avx512vl(auVar27,auVar28);
            uVar49 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
            auVar27._4_4_ = uVar49;
            auVar27._0_4_ = uVar49;
            auVar27._8_4_ = uVar49;
            auVar27._12_4_ = uVar49;
            auVar27 = vsubps_avx512vl(auVar9,auVar27);
            auVar28 = vmulps_avx512vl(auVar61,auVar27);
            auVar29 = vfmsub231ps_avx512vl(auVar28,auVar26,auVar62);
            auVar28 = vmulps_avx512vl(auVar62,auVar25);
            auVar30 = vfmsub231ps_avx512vl(auVar28,auVar27,auVar60);
            auVar28 = vmulps_avx512vl(auVar60,auVar26);
            auVar31 = vfmsub231ps_avx512vl(auVar28,auVar25,auVar61);
            auVar63._0_4_ = fVar44 * local_2498._0_4_;
            auVar63._4_4_ = fVar44 * local_2498._4_4_;
            auVar63._8_4_ = fVar44 * local_2498._8_4_;
            auVar63._12_4_ = fVar44 * local_2498._12_4_;
            auVar28 = vfmadd231ps_fma(auVar63,local_24a8,auVar61);
            auVar28 = vfmadd231ps_fma(auVar28,local_24b8,auVar60);
            auVar9._8_4_ = 0x7fffffff;
            auVar9._0_8_ = 0x7fffffff7fffffff;
            auVar9._12_4_ = 0x7fffffff;
            local_2508 = vandps_avx512vl(auVar28,auVar9);
            auVar32 = vmulps_avx512vl(auVar32,auVar31);
            auVar33 = vfmadd231ps_avx512vl(auVar32,auVar30,auVar33);
            auVar23 = vfmadd231ps_avx512vl(auVar33,auVar29,auVar23);
            auVar10._8_4_ = 0x80000000;
            auVar10._0_8_ = 0x8000000080000000;
            auVar10._12_4_ = 0x80000000;
            auVar33 = vandpd_avx512vl(auVar28,auVar10);
            uVar56 = auVar33._0_4_;
            local_2538._0_4_ = (float)(uVar56 ^ auVar23._0_4_);
            uVar57 = auVar33._4_4_;
            local_2538._4_4_ = (float)(uVar57 ^ auVar23._4_4_);
            uVar58 = auVar33._8_4_;
            local_2538._8_4_ = (float)(uVar58 ^ auVar23._8_4_);
            uVar59 = auVar33._12_4_;
            local_2538._12_4_ = (float)(uVar59 ^ auVar23._12_4_);
            auVar22 = vmulps_avx512vl(auVar22,auVar31);
            auVar34 = vfmadd231ps_avx512vl(auVar22,auVar34,auVar30);
            auVar24 = vfmadd231ps_avx512vl(auVar34,auVar24,auVar29);
            local_2528._0_4_ = (float)(uVar56 ^ auVar24._0_4_);
            local_2528._4_4_ = (float)(uVar57 ^ auVar24._4_4_);
            local_2528._8_4_ = (float)(uVar58 ^ auVar24._8_4_);
            local_2528._12_4_ = (float)(uVar59 ^ auVar24._12_4_);
            auVar24 = ZEXT816(0) << 0x20;
            uVar8 = vcmpps_avx512vl(local_2538,auVar24,5);
            uVar5 = vcmpps_avx512vl(local_2528,auVar24,5);
            uVar6 = vcmpps_avx512vl(auVar28,auVar24,4);
            auVar24._0_4_ = local_2528._0_4_ + local_2538._0_4_;
            auVar24._4_4_ = local_2528._4_4_ + local_2538._4_4_;
            auVar24._8_4_ = local_2528._8_4_ + local_2538._8_4_;
            auVar24._12_4_ = local_2528._12_4_ + local_2538._12_4_;
            uVar7 = vcmpps_avx512vl(auVar24,local_2508,2);
            local_24f7 = (byte)uVar8 & (byte)uVar5 & (byte)uVar6 & (byte)uVar7;
            if (local_24f7 != 0) {
              auVar53._0_4_ = local_2498._0_4_ * auVar27._0_4_;
              auVar53._4_4_ = local_2498._4_4_ * auVar27._4_4_;
              auVar53._8_4_ = local_2498._8_4_ * auVar27._8_4_;
              auVar53._12_4_ = local_2498._12_4_ * auVar27._12_4_;
              auVar24 = vfmadd213ps_fma(auVar26,local_24a8,auVar53);
              auVar24 = vfmadd213ps_fma(auVar25,local_24b8,auVar24);
              local_2518._0_4_ = (float)(uVar56 ^ auVar24._0_4_);
              local_2518._4_4_ = (float)(uVar57 ^ auVar24._4_4_);
              local_2518._8_4_ = (float)(uVar58 ^ auVar24._8_4_);
              local_2518._12_4_ = (float)(uVar59 ^ auVar24._12_4_);
              uVar49 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
              auVar34._4_4_ = uVar49;
              auVar34._0_4_ = uVar49;
              auVar34._8_4_ = uVar49;
              auVar34._12_4_ = uVar49;
              auVar24 = vmulps_avx512vl(local_2508,auVar34);
              fVar44 = (ray->super_RayK<1>).tfar;
              auVar11._4_4_ = fVar44;
              auVar11._0_4_ = fVar44;
              auVar11._8_4_ = fVar44;
              auVar11._12_4_ = fVar44;
              auVar34 = vmulps_avx512vl(local_2508,auVar11);
              uVar8 = vcmpps_avx512vl(local_2518,auVar34,2);
              uVar5 = vcmpps_avx512vl(auVar24,local_2518,1);
              local_24f7 = (byte)uVar8 & (byte)uVar5 & local_24f7;
              if (local_24f7 != 0) {
                lVar18 = lVar18 + uVar21;
                auVar24 = vrcp14ps_avx512vl(local_2508);
                auVar12._8_4_ = 0x3f800000;
                auVar12._0_8_ = &DAT_3f8000003f800000;
                auVar12._12_4_ = 0x3f800000;
                auVar34 = vfnmadd213ps_avx512vl(local_2508,auVar24,auVar12);
                auVar24 = vfmadd132ps_fma(auVar34,auVar24,auVar24);
                fVar44 = auVar24._0_4_;
                local_24c8._0_4_ = fVar44 * local_2518._0_4_;
                fVar50 = auVar24._4_4_;
                local_24c8._4_4_ = fVar50 * local_2518._4_4_;
                fVar51 = auVar24._8_4_;
                local_24c8._8_4_ = fVar51 * local_2518._8_4_;
                fVar52 = auVar24._12_4_;
                local_24c8._12_4_ = fVar52 * local_2518._12_4_;
                auVar47 = ZEXT1664(local_24c8);
                local_24e8[0] = fVar44 * local_2538._0_4_;
                local_24e8[1] = fVar50 * local_2538._4_4_;
                local_24e8[2] = fVar51 * local_2538._8_4_;
                local_24e8[3] = fVar52 * local_2538._12_4_;
                local_24d8[0] = fVar44 * local_2528._0_4_;
                local_24d8[1] = fVar50 * local_2528._4_4_;
                local_24d8[2] = fVar51 * local_2528._8_4_;
                local_24d8[3] = fVar52 * local_2528._12_4_;
                local_25a0 = context->scene;
                auVar45._8_4_ = 0x7f800000;
                auVar45._0_8_ = 0x7f8000007f800000;
                auVar45._12_4_ = 0x7f800000;
                auVar24 = vblendmps_avx512vl(auVar45,local_24c8);
                auVar35._0_4_ =
                     (uint)(local_24f7 & 1) * auVar24._0_4_ |
                     (uint)!(bool)(local_24f7 & 1) * 0x7f800000;
                bVar4 = (bool)(local_24f7 >> 1 & 1);
                auVar35._4_4_ = (uint)bVar4 * auVar24._4_4_ | (uint)!bVar4 * 0x7f800000;
                bVar4 = (bool)(local_24f7 >> 2 & 1);
                auVar35._8_4_ = (uint)bVar4 * auVar24._8_4_ | (uint)!bVar4 * 0x7f800000;
                bVar4 = (bool)(local_24f7 >> 3 & 1);
                auVar35._12_4_ = (uint)bVar4 * auVar24._12_4_ | (uint)!bVar4 * 0x7f800000;
                auVar24 = vshufps_avx(auVar35,auVar35,0xb1);
                auVar24 = vminps_avx(auVar24,auVar35);
                auVar34 = vshufpd_avx(auVar24,auVar24,1);
                auVar24 = vminps_avx(auVar34,auVar24);
                uVar8 = vcmpps_avx512vl(auVar35,auVar24,0);
                local_260c = (uint)local_24f7;
                uVar56 = (uint)((byte)uVar8 & local_24f7);
                if (((byte)uVar8 & local_24f7) == 0) {
                  uVar56 = local_260c;
                }
                uVar16 = 0;
                for (uVar17 = (ulong)uVar56; (uVar17 & 1) == 0;
                    uVar17 = uVar17 >> 1 | 0x8000000000000000) {
                  uVar16 = uVar16 + 1;
                }
                do {
                  local_2550 = *(uint *)(lVar18 + 0x120 + uVar16 * 4);
                  local_25e0 = (ulong)local_2550;
                  local_25d8 = (local_25a0->geometries).items[local_2550].ptr;
                  if ((local_25d8->mask & (ray->super_RayK<1>).mask) == 0) {
                    local_260c = (uint)(~(byte)(1 << ((uint)uVar16 & 0x1f)) & (byte)local_260c);
                    bVar4 = true;
                  }
                  else {
                    local_25f0 = context->args;
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (local_25d8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      bVar4 = false;
                    }
                    else {
                      local_2488 = auVar47._0_16_;
                      local_2478 = auVar71._0_32_;
                      local_2458 = auVar70._0_32_;
                      local_2438 = auVar69._0_32_;
                      local_2418 = auVar68._0_32_;
                      local_23f8 = auVar66._0_32_;
                      local_23d8 = auVar65._0_32_;
                      local_23b8 = auVar64._0_32_;
                      local_2598.context = context->user;
                      local_2568 = *(float *)(local_24b8 + uVar16 * 4);
                      local_2564 = *(undefined4 *)(local_24a8 + uVar16 * 4);
                      local_2560 = *(undefined4 *)(local_2498 + uVar16 * 4);
                      local_255c = local_24e8[uVar16];
                      local_2558 = local_24d8[uVar16];
                      local_2554 = *(undefined4 *)(lVar18 + 0x130 + uVar16 * 4);
                      local_254c = (local_2598.context)->instID[0];
                      local_2548 = (local_2598.context)->instPrimID[0];
                      fVar44 = (ray->super_RayK<1>).tfar;
                      (ray->super_RayK<1>).tfar = *(float *)(local_24c8 + uVar16 * 4);
                      local_25f4 = -1;
                      local_2598.valid = &local_25f4;
                      local_2598.geometryUserPtr = local_25d8->userPtr;
                      local_2598.ray = (RTCRayN *)ray;
                      local_2598.hit = (RTCHitN *)&local_2568;
                      local_2598.N = 1;
                      if ((local_25d8->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                         ((*local_25d8->intersectionFilterN)(&local_2598), *local_2598.valid != 0))
                      {
                        if (local_25f0->filter != (RTCFilterFunctionN)0x0) {
                          if (((local_25f0->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((local_25d8->field_8).field_0x2 & 0x40) != 0)) {
                            (*local_25f0->filter)(&local_2598);
                          }
                          if (*local_2598.valid == 0) goto LAB_01fc0c57;
                        }
                        (((Vec3f *)((long)local_2598.ray + 0x30))->field_0).field_0.x =
                             *(float *)local_2598.hit;
                        (((Vec3f *)((long)local_2598.ray + 0x30))->field_0).field_0.y =
                             *(float *)(local_2598.hit + 4);
                        (((Vec3f *)((long)local_2598.ray + 0x30))->field_0).field_0.z =
                             *(float *)(local_2598.hit + 8);
                        *(float *)((long)local_2598.ray + 0x3c) = *(float *)(local_2598.hit + 0xc);
                        *(float *)((long)local_2598.ray + 0x40) = *(float *)(local_2598.hit + 0x10);
                        *(float *)((long)local_2598.ray + 0x44) = *(float *)(local_2598.hit + 0x14);
                        *(float *)((long)local_2598.ray + 0x48) = *(float *)(local_2598.hit + 0x18);
                        *(float *)((long)local_2598.ray + 0x4c) = *(float *)(local_2598.hit + 0x1c);
                        *(float *)((long)local_2598.ray + 0x50) = *(float *)(local_2598.hit + 0x20);
                      }
                      else {
LAB_01fc0c57:
                        (ray->super_RayK<1>).tfar = fVar44;
                      }
                      auVar47 = ZEXT1664(local_2488);
                      fVar44 = (ray->super_RayK<1>).tfar;
                      auVar13._4_4_ = fVar44;
                      auVar13._0_4_ = fVar44;
                      auVar13._8_4_ = fVar44;
                      auVar13._12_4_ = fVar44;
                      uVar8 = vcmpps_avx512vl(local_2488,auVar13,2);
                      local_260c = (uint)(byte)(~(byte)(1 << ((uint)uVar16 & 0x1f)) &
                                                (byte)local_260c & (byte)uVar8);
                      bVar4 = true;
                      auVar64 = ZEXT3264(local_23b8);
                      auVar65 = ZEXT3264(local_23d8);
                      auVar66 = ZEXT3264(local_23f8);
                      auVar37 = vbroadcastss_avx512vl(ZEXT416(1));
                      auVar67 = ZEXT3264(auVar37);
                      auVar68 = ZEXT3264(local_2418);
                      auVar69 = ZEXT3264(local_2438);
                      auVar70 = ZEXT3264(local_2458);
                      auVar71 = ZEXT3264(local_2478);
                      auVar37 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
                      auVar72 = ZEXT3264(auVar37);
                      auVar37 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
                      auVar73 = ZEXT3264(auVar37);
                      auVar24 = vpbroadcastd_avx512vl(ZEXT416(0x80000000));
                      auVar74 = ZEXT1664(auVar24);
                      auVar37 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
                      auVar75 = ZEXT3264(auVar37);
                      auVar37 = vpmovsxbd_avx512vl(ZEXT816(0x5040302010008));
                      auVar76 = ZEXT3264(auVar37);
                    }
                  }
                  if (!bVar4) {
                    fVar44 = local_24e8[uVar16];
                    fVar50 = local_24d8[uVar16];
                    (ray->super_RayK<1>).tfar = *(float *)(local_24c8 + uVar16 * 4);
                    (ray->Ng).field_0.field_0.x = *(float *)(local_24b8 + uVar16 * 4);
                    (ray->Ng).field_0.field_0.y = *(float *)(local_24a8 + uVar16 * 4);
                    (ray->Ng).field_0.field_0.z = *(float *)(local_2498 + uVar16 * 4);
                    ray->u = fVar44;
                    ray->v = fVar50;
                    ray->primID = *(uint *)(lVar18 + 0x130 + uVar16 * 4);
                    ray->geomID = (uint)local_25e0;
                    pRVar3 = context->user;
                    ray->instID[0] = pRVar3->instID[0];
                    ray->instPrimID[0] = pRVar3->instPrimID[0];
                    break;
                  }
                  bVar14 = (byte)local_260c;
                  if (bVar14 == 0) break;
                  auVar46._8_4_ = 0x7f800000;
                  auVar46._0_8_ = 0x7f8000007f800000;
                  auVar46._12_4_ = 0x7f800000;
                  auVar24 = vblendmps_avx512vl(auVar46,auVar47._0_16_);
                  auVar36._0_4_ =
                       (uint)(bVar14 & 1) * auVar24._0_4_ | (uint)!(bool)(bVar14 & 1) * 0x7f800000;
                  bVar4 = (bool)((byte)(local_260c >> 1) & 1);
                  auVar36._4_4_ = (uint)bVar4 * auVar24._4_4_ | (uint)!bVar4 * 0x7f800000;
                  bVar4 = (bool)((byte)(local_260c >> 2) & 1);
                  auVar36._8_4_ = (uint)bVar4 * auVar24._8_4_ | (uint)!bVar4 * 0x7f800000;
                  bVar4 = (bool)((byte)(local_260c >> 3) & 1);
                  auVar36._12_4_ = (uint)bVar4 * auVar24._12_4_ | (uint)!bVar4 * 0x7f800000;
                  auVar24 = vshufps_avx(auVar36,auVar36,0xb1);
                  auVar24 = vminps_avx(auVar24,auVar36);
                  auVar34 = vshufpd_avx(auVar24,auVar24,1);
                  auVar24 = vminps_avx(auVar34,auVar24);
                  uVar8 = vcmpps_avx512vl(auVar36,auVar24,0);
                  bVar14 = (byte)uVar8 & bVar14;
                  uVar56 = local_260c;
                  if (bVar14 != 0) {
                    uVar56 = (uint)bVar14;
                  }
                  uVar57 = 0;
                  for (; (uVar56 & 1) == 0; uVar56 = uVar56 >> 1 | 0x80000000) {
                    uVar57 = uVar57 + 1;
                  }
                  uVar16 = (ulong)uVar57;
                } while( true );
              }
            }
            lVar19 = lVar19 + 1;
          } while (lVar19 != local_25e8);
        }
        fVar44 = (ray->super_RayK<1>).tfar;
        auVar47 = ZEXT3264(CONCAT428(fVar44,CONCAT424(fVar44,CONCAT420(fVar44,CONCAT416(fVar44,
                                                  CONCAT412(fVar44,CONCAT48(fVar44,CONCAT44(fVar44,
                                                  fVar44))))))));
        auVar55 = ZEXT3264(local_2398);
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }